

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

GLuint __thiscall
glcts::anon_unknown_0::ComputeShaderBase::CreateProgram
          (ComputeShaderBase *this,string *vs,string *fs)

{
  GLuint shader;
  ulong uVar1;
  char *local_58;
  char *src_1 [2];
  char *pcStack_38;
  GLuint sh_1;
  char *src [2];
  GLuint sh;
  GLuint p;
  string *fs_local;
  string *vs_local;
  ComputeShaderBase *this_local;
  
  src[1]._4_4_ = glu::CallLogWrapper::glCreateProgram
                           (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    src[1]._0_4_ = glu::CallLogWrapper::glCreateShader
                             (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8b31
                             );
    glu::CallLogWrapper::glAttachShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,src[1]._4_4_,
               (GLuint)src[1]);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,(GLuint)src[1]);
    pcStack_38 = "#version 310 es\n";
    src[0] = (char *)std::__cxx11::string::c_str();
    glu::CallLogWrapper::glShaderSource
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,(GLuint)src[1],2,
               &stack0xffffffffffffffc8,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,(GLuint)src[1]);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    shader = glu::CallLogWrapper::glCreateShader
                       (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8b30);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,src[1]._4_4_,shader);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,shader);
    local_58 = "#version 310 es\n";
    src_1[0] = (char *)std::__cxx11::string::c_str();
    glu::CallLogWrapper::glShaderSource
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,shader,2,&local_58,
               (GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,shader);
  }
  return src[1]._4_4_;
}

Assistant:

GLuint CreateProgram(const std::string& vs, const std::string& fs)
	{
		const GLuint p = glCreateProgram();

		if (!vs.empty())
		{
			const GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[2] = { kGLSLVer, vs.c_str() };
			glShaderSource(sh, 2, src, NULL);
			glCompileShader(sh);
		}
		if (!fs.empty())
		{
			const GLuint sh = glCreateShader(GL_FRAGMENT_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[2] = { kGLSLVer, fs.c_str() };
			glShaderSource(sh, 2, src, NULL);
			glCompileShader(sh);
		}

		return p;
	}